

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,FuncCallArgs *call_args,void *data)

{
  bool bVar1;
  pointer pSVar2;
  long in_RSI;
  undefined8 in_RDI;
  ExpVarData exp_var_data;
  ExpListData exp_list_data;
  ExpVarData local_28;
  ExpListData local_1c [3];
  long local_10;
  
  local_10 = in_RSI;
  if (*(int *)(in_RSI + 0x10) == 0) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       0x1e6006);
    if (bVar1) {
      ExpListData::ExpListData(local_1c);
      pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                         ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                          0x1e6024);
      (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,local_1c);
      *(int *)(local_10 + 0x14) = local_1c[0].exp_value_count_;
    }
  }
  else {
    ExpVarData::ExpVarData(&local_28,SemanticOp_Read);
    pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x1e6062);
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,&local_28);
    *(undefined4 *)(local_10 + 0x14) = 1;
  }
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(FuncCallArgs *call_args, void *data)
    {
        if (call_args->type_ == FuncCallArgs::ExpList)
        {
            if (call_args->arg_)
            {
                ExpListData exp_list_data;
                call_args->arg_->Accept(this, &exp_list_data);
                call_args->arg_value_count_ = exp_list_data.exp_value_count_;
            }
        }
        else
        {
            ExpVarData exp_var_data{ SemanticOp_Read };
            call_args->arg_->Accept(this, &exp_var_data);
            call_args->arg_value_count_ = 1;
        }
    }